

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O0

int __thiscall google::protobuf::internal::CachedSize::Get(CachedSize *this)

{
  int *in_RDI;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return *in_RDI;
}

Assistant:

void Set(int size) { size_.store(size, std::memory_order_relaxed); }